

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  Scene *pSVar14;
  float **ppfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  Geometry *pGVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  int iVar30;
  undefined4 uVar31;
  long lVar32;
  RTCRayN *pRVar33;
  ulong uVar34;
  ulong uVar35;
  uint *puVar36;
  ulong uVar37;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar38;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar72;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  uint uVar73;
  uint uVar88;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar92;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar98;
  float fVar109;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar135;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 local_1478 [8];
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1458 [8];
  float fStack_1450;
  float fStack_144c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  undefined8 local_1428;
  float fStack_1420;
  float fStack_141c;
  vbool<4> valid;
  Scene *scene;
  undefined1 local_13d8 [16];
  RTCFilterFunctionNArguments args;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float fStack_130c;
  vfloat<4> tNear;
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  float local_1278 [4];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  long local_11b0;
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined4 local_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  uint local_1138;
  uint uStack_1134;
  uint uStack_1130;
  uint uStack_112c;
  uint local_1128;
  uint uStack_1124;
  uint uStack_1120;
  uint uStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined8 local_1008;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar38 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar72 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar98 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar109 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar136 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar142 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar146 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar165 = fVar136 * 0.99999964;
  fVar126 = fVar142 * 0.99999964;
  fVar158 = fVar146 * 0.99999964;
  fVar136 = fVar136 * 1.0000004;
  fVar142 = fVar142 * 1.0000004;
  fVar146 = fVar146 * 1.0000004;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar30 = (tray->tnear).field_0.i[k];
  auVar51._4_4_ = iVar30;
  auVar51._0_4_ = iVar30;
  auVar51._8_4_ = iVar30;
  auVar51._12_4_ = iVar30;
  iVar30 = (tray->tfar).field_0.i[k];
  auVar121._4_4_ = iVar30;
  auVar121._0_4_ = iVar30;
  auVar121._8_4_ = iVar30;
  auVar121._12_4_ = iVar30;
  local_1108 = mm_lookupmask_ps._0_8_;
  uStack_1100 = mm_lookupmask_ps._8_8_;
  local_1118 = mm_lookupmask_ps._240_8_;
  uStack_1110 = mm_lookupmask_ps._248_8_;
  local_1068 = fVar72;
  fStack_1064 = fVar72;
  fStack_1060 = fVar72;
  fStack_105c = fVar72;
  local_1078 = fVar98;
  fStack_1074 = fVar98;
  fStack_1070 = fVar98;
  fStack_106c = fVar98;
  local_1088 = fVar109;
  fStack_1084 = fVar109;
  fStack_1080 = fVar109;
  fStack_107c = fVar109;
  local_1098 = fVar136;
  fStack_1094 = fVar136;
  fStack_1090 = fVar136;
  fStack_108c = fVar136;
  local_10a8 = fVar142;
  fStack_10a4 = fVar142;
  fStack_10a0 = fVar142;
  fStack_109c = fVar142;
  local_10b8 = fVar146;
  fStack_10b4 = fVar146;
  fStack_10b0 = fVar146;
  fStack_10ac = fVar146;
  local_10c8 = fVar158;
  fStack_10c4 = fVar158;
  fStack_10c0 = fVar158;
  fStack_10bc = fVar158;
  local_10d8 = fVar165;
  fStack_10d4 = fVar165;
  fStack_10d0 = fVar165;
  fStack_10cc = fVar165;
  local_10e8 = fVar126;
  fStack_10e4 = fVar126;
  fStack_10e0 = fVar126;
  fStack_10dc = fVar126;
  local_10f8 = auVar51;
  fVar127 = fVar126;
  fVar128 = fVar126;
  fVar139 = fVar126;
  fVar129 = fVar72;
  fVar140 = fVar72;
  fVar97 = fVar72;
  fVar141 = fVar109;
  fVar130 = fVar109;
  fVar131 = fVar109;
  fVar132 = fVar98;
  fVar135 = fVar98;
  fVar147 = fVar98;
  fVar148 = fVar136;
  fVar152 = fVar136;
  fVar153 = fVar136;
  fVar154 = fVar142;
  fVar155 = fVar142;
  fVar156 = fVar142;
  fVar157 = fVar146;
  fVar159 = fVar146;
  fVar161 = fVar146;
  fVar162 = fVar158;
  fVar163 = fVar158;
  fVar166 = fVar158;
  fVar169 = fVar165;
  fVar170 = fVar165;
  fVar149 = fVar165;
LAB_007153ba:
  do {
    do {
      if (pSVar38 == stack) {
        return;
      }
      pSVar39 = pSVar38 + -1;
      pSVar38 = pSVar38 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar39->dist &&
             (float)pSVar39->dist != *(float *)(ray + k * 4 + 0x80));
    local_1428 = stack;
    pSVar39 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar38->ptr).ptr;
    while (((ulong)pSVar39 & 8) == 0) {
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + uVar37);
      auVar41._0_4_ = (*pfVar10 - fVar72) * fVar165;
      auVar41._4_4_ = (pfVar10[1] - fVar129) * fVar169;
      auVar41._8_4_ = (pfVar10[2] - fVar140) * fVar170;
      auVar41._12_4_ = (pfVar10[3] - fVar97) * fVar149;
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + uVar35);
      auVar117._0_4_ = (*pfVar10 - fVar98) * fVar126;
      auVar117._4_4_ = (pfVar10[1] - fVar132) * fVar127;
      auVar117._8_4_ = (pfVar10[2] - fVar135) * fVar128;
      auVar117._12_4_ = (pfVar10[3] - fVar147) * fVar139;
      auVar41 = maxps(auVar41,auVar117);
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + uVar34);
      auVar118._0_4_ = (*pfVar10 - fVar109) * fVar158;
      auVar118._4_4_ = (pfVar10[1] - fVar141) * fVar162;
      auVar118._8_4_ = (pfVar10[2] - fVar130) * fVar163;
      auVar118._12_4_ = (pfVar10[3] - fVar131) * fVar166;
      auVar89 = maxps(auVar118,auVar51);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar41,auVar89);
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + (uVar37 ^ 0x10));
      auVar90._0_4_ = (*pfVar10 - fVar72) * fVar136;
      auVar90._4_4_ = (pfVar10[1] - fVar129) * fVar148;
      auVar90._8_4_ = (pfVar10[2] - fVar140) * fVar152;
      auVar90._12_4_ = (pfVar10[3] - fVar97) * fVar153;
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + (uVar35 ^ 0x10));
      auVar99._0_4_ = (*pfVar10 - fVar98) * fVar142;
      auVar99._4_4_ = (pfVar10[1] - fVar132) * fVar154;
      auVar99._8_4_ = (pfVar10[2] - fVar135) * fVar155;
      auVar99._12_4_ = (pfVar10[3] - fVar147) * fVar156;
      auVar41 = minps(auVar90,auVar99);
      pfVar10 = (float *)((long)&pSVar39[2].ptr.ptr + (uVar34 ^ 0x10));
      auVar100._0_4_ = (*pfVar10 - fVar109) * fVar146;
      auVar100._4_4_ = (pfVar10[1] - fVar141) * fVar157;
      auVar100._8_4_ = (pfVar10[2] - fVar130) * fVar159;
      auVar100._12_4_ = (pfVar10[3] - fVar131) * fVar161;
      auVar89 = minps(auVar100,auVar121);
      auVar41 = minps(auVar41,auVar89);
      auVar89._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar41._4_4_);
      auVar89._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar41._0_4_);
      auVar89._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar41._8_4_);
      auVar89._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar41._12_4_);
      uVar29 = movmskps((int)local_1428,auVar89);
      if (uVar29 == 0) goto LAB_007153ba;
      uVar29 = uVar29 & 0xff;
      uVar40 = (ulong)pSVar39 & 0xfffffffffffffff0;
      lVar21 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      local_1428 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar40 + lVar21 * 8);
      uVar29 = uVar29 - 1 & uVar29;
      pSVar39 = local_1428;
      if (uVar29 != 0) {
        uVar73 = tNear.field_0.i[lVar21];
        lVar21 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        pSVar39 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar40 + lVar21 * 8);
        uVar88 = tNear.field_0.i[lVar21];
        uVar29 = uVar29 - 1 & uVar29;
        if (uVar29 == 0) {
          if (uVar73 < uVar88) {
            (pSVar38->ptr).ptr = (size_t)pSVar39;
            pSVar38->dist = uVar88;
            pSVar38 = pSVar38 + 1;
            pSVar39 = local_1428;
          }
          else {
            (pSVar38->ptr).ptr = (size_t)local_1428;
            pSVar38->dist = uVar73;
            local_1428 = pSVar39;
            pSVar38 = pSVar38 + 1;
          }
        }
        else {
          auVar91._8_4_ = uVar73;
          auVar91._0_8_ = local_1428;
          auVar91._12_4_ = 0;
          auVar110._8_4_ = uVar88;
          auVar110._0_8_ = pSVar39;
          auVar110._12_4_ = 0;
          lVar21 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar13 = *(undefined8 *)(uVar40 + lVar21 * 8);
          iVar30 = tNear.field_0.i[lVar21];
          auVar101._8_4_ = iVar30;
          auVar101._0_8_ = uVar13;
          auVar101._12_4_ = 0;
          auVar42._8_4_ = -(uint)((int)uVar73 < (int)uVar88);
          uVar29 = uVar29 - 1 & uVar29;
          if (uVar29 == 0) {
            auVar42._4_4_ = auVar42._8_4_;
            auVar42._0_4_ = auVar42._8_4_;
            auVar42._12_4_ = auVar42._8_4_;
            auVar116._8_4_ = uVar88;
            auVar116._0_8_ = pSVar39;
            auVar116._12_4_ = 0;
            auVar117 = blendvps(auVar116,auVar91,auVar42);
            auVar41 = blendvps(auVar91,auVar110,auVar42);
            auVar43._8_4_ = -(uint)(auVar117._8_4_ < iVar30);
            auVar43._4_4_ = auVar43._8_4_;
            auVar43._0_4_ = auVar43._8_4_;
            auVar43._12_4_ = auVar43._8_4_;
            auVar111._8_4_ = iVar30;
            auVar111._0_8_ = uVar13;
            auVar111._12_4_ = 0;
            auVar89 = blendvps(auVar111,auVar117,auVar43);
            auVar117 = blendvps(auVar117,auVar101,auVar43);
            auVar44._8_4_ = -(uint)(auVar41._8_4_ < auVar117._8_4_);
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar44._8_4_;
            auVar44._12_4_ = auVar44._8_4_;
            SVar102 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar117,auVar41,auVar44);
            SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar41,auVar117,auVar44);
            *pSVar38 = SVar92;
            pSVar38[1] = SVar102;
            local_1428 = auVar89._0_8_;
            pSVar38 = pSVar38 + 2;
            pSVar39 = local_1428;
          }
          else {
            lVar21 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            auVar45._4_4_ = auVar42._8_4_;
            auVar45._0_4_ = auVar42._8_4_;
            auVar45._8_4_ = auVar42._8_4_;
            auVar45._12_4_ = auVar42._8_4_;
            auVar118 = blendvps(auVar110,auVar91,auVar45);
            auVar41 = blendvps(auVar91,auVar110,auVar45);
            fStack_1470 = (float)tNear.field_0.i[lVar21];
            local_1478 = (undefined1  [8])*(undefined8 *)(uVar40 + lVar21 * 8);
            fStack_146c = 0.0;
            auVar46._8_4_ = -(uint)(iVar30 < tNear.field_0.i[lVar21]);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            _local_1458 = blendvps(_local_1478,auVar101,auVar46);
            auVar89 = blendvps(auVar101,_local_1478,auVar46);
            auVar47._8_4_ = -(uint)(auVar41._8_4_ < auVar89._8_4_);
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            auVar117 = blendvps(auVar89,auVar41,auVar47);
            SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar41,auVar89,auVar47);
            auVar48._8_4_ = -(uint)(auVar118._8_4_ < local_1458._8_4_);
            auVar48._4_4_ = auVar48._8_4_;
            auVar48._0_4_ = auVar48._8_4_;
            auVar48._12_4_ = auVar48._8_4_;
            auVar41 = blendvps(_local_1458,auVar118,auVar48);
            auVar89 = blendvps(auVar118,_local_1458,auVar48);
            auVar49._8_4_ = -(uint)(auVar89._8_4_ < auVar117._8_4_);
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            SVar102 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar117,auVar89,auVar49);
            SVar119 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar89,auVar117,auVar49);
            *pSVar38 = SVar92;
            pSVar38[1] = SVar119;
            pSVar38[2] = SVar102;
            local_1428 = auVar41._0_8_;
            pSVar38 = pSVar38 + 3;
            pSVar39 = local_1428;
          }
        }
      }
    }
    local_11b8 = (ulong)((uint)pSVar39 & 0xf) - 8;
    for (local_11b0 = 0; local_11b0 != local_11b8; local_11b0 = local_11b0 + 1) {
      lVar32 = local_11b0 * 0x60;
      pSVar14 = context->scene;
      puVar1 = (uint *)(((ulong)pSVar39 & 0xfffffffffffffff0) + lVar32);
      puVar36 = puVar1 + 0x10;
      ppfVar15 = (pSVar14->vertices).items;
      pfVar16 = ppfVar15[*puVar36];
      pfVar10 = pfVar16 + *puVar1;
      uVar13 = *(undefined8 *)(pfVar16 + puVar1[4]);
      uVar26 = *(undefined8 *)(pfVar16 + puVar1[4] + 2);
      pfVar2 = pfVar16 + puVar1[0xc];
      pfVar17 = ppfVar15[puVar1[0x11]];
      pfVar3 = pfVar17 + puVar1[1];
      pfVar4 = pfVar17 + puVar1[5];
      fVar136 = pfVar4[2];
      pfVar5 = pfVar17 + puVar1[0xd];
      pfVar18 = ppfVar15[puVar1[0x12]];
      fStack_11f0 = pfVar18[puVar1[6]];
      fStack_1010 = (pfVar18 + puVar1[6])[1];
      pfVar6 = pfVar18 + puVar1[10];
      pfVar7 = pfVar18 + puVar1[0xe];
      pfVar19 = ppfVar15[puVar1[0x13]];
      fStack_11ec = pfVar19[puVar1[7]];
      fStack_100c = (pfVar19 + puVar1[7])[1];
      pfVar8 = pfVar19 + puVar1[0xb];
      pfVar9 = pfVar19 + puVar1[0xf];
      local_1438 = (float)uVar13;
      fStack_1434 = (float)((ulong)uVar13 >> 0x20);
      fStack_1430 = (float)uVar26;
      local_11b8 = CONCAT44(pfVar8[2],pfVar6[2]);
      local_11d8 = CONCAT44(pfVar17[puVar1[9]],pfVar16[puVar1[8]]);
      local_11c8 = *pfVar6;
      fStack_11c4 = *pfVar8;
      local_11e8 = (pfVar16 + puVar1[8])[1];
      fStack_11e4 = (pfVar17 + puVar1[9])[1];
      fStack_11e0 = pfVar6[1];
      fStack_11dc = pfVar8[1];
      fVar72 = *(float *)(ray + k * 4);
      fVar98 = *(float *)(ray + k * 4 + 0x10);
      fVar130 = *pfVar10 - fVar72;
      fVar131 = *pfVar3 - fVar72;
      fStack_1450 = fStack_1450 - fVar72;
      fStack_144c = fStack_144c - fVar72;
      local_1438 = local_1438 - fVar72;
      fVar127 = *pfVar4 - fVar72;
      fVar128 = fStack_11f0 - fVar72;
      fVar129 = fStack_11ec - fVar72;
      local_1208 = CONCAT44(*pfVar5,*pfVar2);
      local_11f8 = *pfVar7;
      fStack_11f4 = *pfVar9;
      fVar142 = *pfVar2 - fVar72;
      fVar146 = *pfVar5 - fVar72;
      fVar126 = *pfVar7 - fVar72;
      fVar72 = *pfVar9 - fVar72;
      fVar109 = *(float *)(ray + k * 4 + 0x20);
      local_f88 = pfVar10[1] - fVar98;
      fStack_f84 = pfVar3[1] - fVar98;
      fStack_f80 = pfVar18[(ulong)puVar1[2] + 1] - fVar98;
      fStack_f7c = pfVar19[(ulong)puVar1[3] + 1] - fVar98;
      fVar147 = pfVar10[2] - fVar109;
      fVar152 = pfVar3[2] - fVar109;
      fVar154 = pfVar18[(ulong)puVar1[2] + 2] - fVar109;
      fVar156 = pfVar19[(ulong)puVar1[3] + 2] - fVar109;
      local_1028 = pfVar2[1];
      fStack_1024 = pfVar5[1];
      fStack_1020 = pfVar7[1];
      fStack_101c = pfVar9[1];
      local_1388 = pfVar2[1] - fVar98;
      fStack_1384 = pfVar5[1] - fVar98;
      fStack_1380 = pfVar7[1] - fVar98;
      fStack_137c = pfVar9[1] - fVar98;
      local_1008 = CONCAT44(pfVar5[2],pfVar2[2]);
      local_ff8 = pfVar7[2];
      fStack_ff4 = pfVar9[2];
      local_1328 = pfVar2[2] - fVar109;
      fStack_1324 = pfVar5[2] - fVar109;
      fStack_1320 = pfVar7[2] - fVar109;
      fStack_131c = pfVar9[2] - fVar109;
      local_f98 = fVar142 - fVar130;
      fStack_f94 = fVar146 - fVar131;
      fStack_f90 = fVar126 - fStack_1450;
      fStack_f8c = fVar72 - fStack_144c;
      local_fb8 = local_1388 - local_f88;
      fStack_fb4 = fStack_1384 - fStack_f84;
      fStack_fb0 = fStack_1380 - fStack_f80;
      fStack_fac = fStack_137c - fStack_f7c;
      local_fa8 = local_1328 - fVar147;
      fStack_fa4 = fStack_1324 - fVar152;
      fStack_fa0 = fStack_1320 - fVar154;
      fStack_f9c = fStack_131c - fVar156;
      local_1478._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
      local_1428._4_4_ = *(float *)(ray + k * 4 + 0x60);
      fStack_130c = *(float *)(ray + k * 4 + 0x40);
      fVar132 = (local_fb8 * (local_1328 + fVar147) - (local_1388 + local_f88) * local_fa8) *
                fStack_130c +
                ((fVar142 + fVar130) * local_fa8 - (local_1328 + fVar147) * local_f98) *
                (float)local_1478._4_4_ +
                (local_f98 * (local_1388 + local_f88) - (fVar142 + fVar130) * local_fb8) *
                local_1428._4_4_;
      fVar135 = (fStack_fb4 * (fStack_1324 + fVar152) - (fStack_1384 + fStack_f84) * fStack_fa4) *
                fStack_130c +
                ((fVar146 + fVar131) * fStack_fa4 - (fStack_1324 + fVar152) * fStack_f94) *
                (float)local_1478._4_4_ +
                (fStack_f94 * (fStack_1384 + fStack_f84) - (fVar146 + fVar131) * fStack_fb4) *
                local_1428._4_4_;
      local_1048._0_8_ = CONCAT44(fVar135,fVar132);
      local_1048._8_4_ =
           (fStack_fb0 * (fStack_1320 + fVar154) - (fStack_1380 + fStack_f80) * fStack_fa0) *
           fStack_130c +
           ((fVar126 + fStack_1450) * fStack_fa0 - (fStack_1320 + fVar154) * fStack_f90) *
           (float)local_1478._4_4_ +
           (fStack_f90 * (fStack_1380 + fStack_f80) - (fVar126 + fStack_1450) * fStack_fb0) *
           local_1428._4_4_;
      local_1048._12_4_ =
           (fStack_fac * (fStack_131c + fVar156) - (fStack_137c + fStack_f7c) * fStack_f9c) *
           fStack_130c +
           ((fVar72 + fStack_144c) * fStack_f9c - (fStack_131c + fVar156) * fStack_f8c) *
           (float)local_1478._4_4_ +
           (fStack_f8c * (fStack_137c + fStack_f7c) - (fVar72 + fStack_144c) * fStack_fac) *
           local_1428._4_4_;
      local_1018 = fStack_1434;
      fStack_1014 = pfVar4[1];
      fStack_1434 = fStack_1434 - fVar98;
      fVar139 = pfVar4[1] - fVar98;
      fVar140 = fStack_1010 - fVar98;
      fVar141 = fStack_100c - fVar98;
      fStack_142c = (float)((ulong)uVar26 >> 0x20);
      local_1218 = fVar109;
      fStack_1214 = fVar109;
      fStack_1210 = fVar109;
      fStack_120c = fVar109;
      local_1358 = fStack_1430 - fVar109;
      fStack_1354 = fVar136 - fVar109;
      fStack_1350 = fStack_1430 - fVar109;
      fStack_134c = fStack_142c - fVar109;
      local_fd8 = fVar130 - local_1438;
      fStack_fd4 = fVar131 - fVar127;
      fStack_fd0 = fStack_1450 - fVar128;
      fStack_fcc = fStack_144c - fVar129;
      fVar159 = local_f88 - fStack_1434;
      fVar161 = fStack_f84 - fVar139;
      fVar162 = fStack_f80 - fVar140;
      fVar163 = fStack_f7c - fVar141;
      local_fc8 = fVar147 - local_1358;
      fStack_fc4 = fVar152 - fStack_1354;
      fStack_fc0 = fVar154 - fStack_1350;
      fStack_fbc = fVar156 - fStack_134c;
      local_1038._0_4_ =
           (fVar159 * (fVar147 + local_1358) - (local_f88 + fStack_1434) * local_fc8) * fStack_130c
           + ((fVar130 + local_1438) * local_fc8 - (fVar147 + local_1358) * local_fd8) *
             (float)local_1478._4_4_ +
             (local_fd8 * (local_f88 + fStack_1434) - (fVar130 + local_1438) * fVar159) *
             local_1428._4_4_;
      local_1038._4_4_ =
           (fVar161 * (fVar152 + fStack_1354) - (fStack_f84 + fVar139) * fStack_fc4) * fStack_130c +
           ((fVar131 + fVar127) * fStack_fc4 - (fVar152 + fStack_1354) * fStack_fd4) *
           (float)local_1478._4_4_ +
           (fStack_fd4 * (fStack_f84 + fVar139) - (fVar131 + fVar127) * fVar161) * local_1428._4_4_;
      local_1038._8_4_ =
           (fVar162 * (fVar154 + fStack_1350) - (fStack_f80 + fVar140) * fStack_fc0) * fStack_130c +
           ((fStack_1450 + fVar128) * fStack_fc0 - (fVar154 + fStack_1350) * fStack_fd0) *
           (float)local_1478._4_4_ +
           (fStack_fd0 * (fStack_f80 + fVar140) - (fStack_1450 + fVar128) * fVar162) *
           local_1428._4_4_;
      local_1038._12_4_ =
           (fVar163 * (fVar156 + fStack_134c) - (fStack_f7c + fVar141) * fStack_fbc) * fStack_130c +
           ((fStack_144c + fVar129) * fStack_fbc - (fVar156 + fStack_134c) * fStack_fcc) *
           (float)local_1478._4_4_ +
           (fStack_fcc * (fStack_f7c + fVar141) - (fStack_144c + fVar129) * fVar163) *
           local_1428._4_4_;
      fVar166 = local_1438 - fVar142;
      fVar158 = fVar127 - fVar146;
      fVar169 = fVar128 - fVar126;
      fVar170 = fVar129 - fVar72;
      fVar148 = fStack_1434 - local_1388;
      fVar153 = fVar139 - fStack_1384;
      fVar155 = fVar140 - fStack_1380;
      fVar157 = fVar141 - fStack_137c;
      local_fe8 = local_1358 - local_1328;
      fStack_fe4 = fStack_1354 - fStack_1324;
      fStack_fe0 = fStack_1350 - fStack_1320;
      fStack_fdc = fStack_134c - fStack_131c;
      local_1228 = fStack_1434;
      fStack_1224 = fVar139;
      fStack_1220 = fVar140;
      fStack_121c = fVar141;
      local_1348 = fStack_1434 + local_1388;
      fStack_1344 = fVar139 + fStack_1384;
      fStack_1340 = fVar140 + fStack_1380;
      fStack_133c = fVar141 + fStack_137c;
      local_1338 = local_1358 + local_1328;
      fStack_1334 = fStack_1354 + fStack_1324;
      fStack_1330 = fStack_1350 + fStack_1320;
      fStack_132c = fStack_134c + fStack_131c;
      local_1428._0_4_ = local_1428._4_4_;
      fStack_1420 = local_1428._4_4_;
      fStack_141c = local_1428._4_4_;
      local_1478._0_4_ = local_1478._4_4_;
      fStack_1470 = (float)local_1478._4_4_;
      fStack_146c = (float)local_1478._4_4_;
      auVar74._0_4_ =
           (fVar148 * local_1338 - local_1348 * local_fe8) * fStack_130c +
           ((fVar142 + local_1438) * local_fe8 - fVar166 * local_1338) * (float)local_1478._4_4_ +
           (fVar166 * local_1348 - (fVar142 + local_1438) * fVar148) * local_1428._4_4_;
      auVar74._4_4_ =
           (fVar153 * fStack_1334 - fStack_1344 * fStack_fe4) * fStack_130c +
           ((fVar146 + fVar127) * fStack_fe4 - fVar158 * fStack_1334) * (float)local_1478._4_4_ +
           (fVar158 * fStack_1344 - (fVar146 + fVar127) * fVar153) * local_1428._4_4_;
      auVar74._8_4_ =
           (fVar155 * fStack_1330 - fStack_1340 * fStack_fe0) * fStack_130c +
           ((fVar126 + fVar128) * fStack_fe0 - fVar169 * fStack_1330) * (float)local_1478._4_4_ +
           (fVar169 * fStack_1340 - (fVar126 + fVar128) * fVar155) * local_1428._4_4_;
      auVar74._12_4_ =
           (fVar157 * fStack_132c - fStack_133c * fStack_fdc) * fStack_130c +
           ((fVar72 + fVar129) * fStack_fdc - fVar170 * fStack_132c) * (float)local_1478._4_4_ +
           (fVar170 * fStack_133c - (fVar72 + fVar129) * fVar157) * local_1428._4_4_;
      fVar127 = fVar132 + local_1038._0_4_ + auVar74._0_4_;
      fVar128 = fVar135 + local_1038._4_4_ + auVar74._4_4_;
      fVar129 = local_1048._8_4_ + local_1038._8_4_ + auVar74._8_4_;
      fVar97 = local_1048._12_4_ + local_1038._12_4_ + auVar74._12_4_;
      auVar50._8_4_ = local_1048._8_4_;
      auVar50._0_8_ = local_1048._0_8_;
      auVar50._12_4_ = local_1048._12_4_;
      auVar51 = minps(auVar50,local_1038);
      auVar51 = minps(auVar51,auVar74);
      auVar120._8_4_ = local_1048._8_4_;
      auVar120._0_8_ = local_1048._0_8_;
      auVar120._12_4_ = local_1048._12_4_;
      auVar121 = maxps(auVar120,local_1038);
      auVar121 = maxps(auVar121,auVar74);
      fVar72 = ABS(fVar127) * 1.1920929e-07;
      fVar142 = ABS(fVar128) * 1.1920929e-07;
      fVar146 = ABS(fVar129) * 1.1920929e-07;
      fVar126 = ABS(fVar97) * 1.1920929e-07;
      auVar122._4_4_ = -(uint)(auVar121._4_4_ <= fVar142);
      auVar122._0_4_ = -(uint)(auVar121._0_4_ <= fVar72);
      auVar122._8_4_ = -(uint)(auVar121._8_4_ <= fVar146);
      auVar122._12_4_ = -(uint)(auVar121._12_4_ <= fVar126);
      auVar52._4_4_ = -(uint)(-fVar142 <= auVar51._4_4_);
      auVar52._0_4_ = -(uint)(-fVar72 <= auVar51._0_4_);
      auVar52._8_4_ = -(uint)(-fVar146 <= auVar51._8_4_);
      auVar52._12_4_ = -(uint)(-fVar126 <= auVar51._12_4_);
      auVar122 = auVar122 | auVar52;
      lVar21 = ((ulong)pSVar39 & 0xfffffffffffffff0) + lVar32;
      uVar29 = movmskps((int)lVar32,auVar122);
      if (uVar29 == 0) {
LAB_00716e55:
        auVar114._4_4_ = fVar98;
        auVar114._0_4_ = fVar98;
        auVar114._8_4_ = fVar98;
        auVar114._12_4_ = fVar98;
      }
      else {
        local_1058 = fVar127;
        fStack_1054 = fVar128;
        fStack_1050 = fVar129;
        fStack_104c = fVar97;
        local_ff8 = fVar148;
        fStack_ff4 = fVar153;
        fStack_ff0 = fVar155;
        fStack_fec = fVar157;
        auVar137._0_4_ = local_fb8 * local_fc8 - fVar159 * local_fa8;
        auVar137._4_4_ = fStack_fb4 * fStack_fc4 - fVar161 * fStack_fa4;
        auVar137._8_4_ = fStack_fb0 * fStack_fc0 - fVar162 * fStack_fa0;
        auVar137._12_4_ = fStack_fac * fStack_fbc - fVar163 * fStack_f9c;
        auVar160._0_4_ = fVar159 * local_fe8 - fVar148 * local_fc8;
        auVar160._4_4_ = fVar161 * fStack_fe4 - fVar153 * fStack_fc4;
        auVar160._8_4_ = fVar162 * fStack_fe0 - fVar155 * fStack_fc0;
        auVar160._12_4_ = fVar163 * fStack_fdc - fVar157 * fStack_fbc;
        auVar53._4_4_ = -(uint)(ABS(fVar161 * fStack_fa4) < ABS(fVar153 * fStack_fc4));
        auVar53._0_4_ = -(uint)(ABS(fVar159 * local_fa8) < ABS(fVar148 * local_fc8));
        auVar53._8_4_ = -(uint)(ABS(fVar162 * fStack_fa0) < ABS(fVar155 * fStack_fc0));
        auVar53._12_4_ = -(uint)(ABS(fVar163 * fStack_f9c) < ABS(fVar157 * fStack_fbc));
        local_1268 = blendvps(auVar160,auVar137,auVar53);
        auVar143._0_4_ = local_fa8 * local_fd8 - local_f98 * local_fc8;
        auVar143._4_4_ = fStack_fa4 * fStack_fd4 - fStack_f94 * fStack_fc4;
        auVar143._8_4_ = fStack_fa0 * fStack_fd0 - fStack_f90 * fStack_fc0;
        auVar143._12_4_ = fStack_f9c * fStack_fcc - fStack_f8c * fStack_fbc;
        auVar167._0_4_ = fVar166 * local_fc8 - local_fd8 * local_fe8;
        auVar167._4_4_ = fVar158 * fStack_fc4 - fStack_fd4 * fStack_fe4;
        auVar167._8_4_ = fVar169 * fStack_fc0 - fStack_fd0 * fStack_fe0;
        auVar167._12_4_ = fVar170 * fStack_fbc - fStack_fcc * fStack_fdc;
        auVar54._4_4_ = -(uint)(ABS(fStack_f94 * fStack_fc4) < ABS(fStack_fd4 * fStack_fe4));
        auVar54._0_4_ = -(uint)(ABS(local_f98 * local_fc8) < ABS(local_fd8 * local_fe8));
        auVar54._8_4_ = -(uint)(ABS(fStack_f90 * fStack_fc0) < ABS(fStack_fd0 * fStack_fe0));
        auVar54._12_4_ = -(uint)(ABS(fStack_f8c * fStack_fbc) < ABS(fStack_fcc * fStack_fdc));
        local_1258 = blendvps(auVar167,auVar143,auVar54);
        auVar112._0_4_ = local_f98 * fVar159 - local_fd8 * local_fb8;
        auVar112._4_4_ = fStack_f94 * fVar161 - fStack_fd4 * fStack_fb4;
        auVar112._8_4_ = fStack_f90 * fVar162 - fStack_fd0 * fStack_fb0;
        auVar112._12_4_ = fStack_f8c * fVar163 - fStack_fcc * fStack_fac;
        auVar150._0_4_ = local_fd8 * fVar148 - fVar166 * fVar159;
        auVar150._4_4_ = fStack_fd4 * fVar153 - fVar158 * fVar161;
        auVar150._8_4_ = fStack_fd0 * fVar155 - fVar169 * fVar162;
        auVar150._12_4_ = fStack_fcc * fVar157 - fVar170 * fVar163;
        auVar55._4_4_ = -(uint)(ABS(fStack_fd4 * fStack_fb4) < ABS(fVar158 * fVar161));
        auVar55._0_4_ = -(uint)(ABS(local_fd8 * local_fb8) < ABS(fVar166 * fVar159));
        auVar55._8_4_ = -(uint)(ABS(fStack_fd0 * fStack_fb0) < ABS(fVar169 * fVar162));
        auVar55._12_4_ = -(uint)(ABS(fStack_fcc * fStack_fac) < ABS(fVar170 * fVar163));
        local_1248 = blendvps(auVar150,auVar112,auVar55);
        fVar72 = fStack_130c * local_1268._0_4_ +
                 (float)local_1478._4_4_ * local_1258._0_4_ + local_1428._4_4_ * local_1248._0_4_;
        fVar142 = fStack_130c * local_1268._4_4_ +
                  (float)local_1478._4_4_ * local_1258._4_4_ + local_1428._4_4_ * local_1248._4_4_;
        fVar146 = fStack_130c * local_1268._8_4_ +
                  (float)local_1478._4_4_ * local_1258._8_4_ + local_1428._4_4_ * local_1248._8_4_;
        fVar126 = fStack_130c * local_1268._12_4_ +
                  (float)local_1478._4_4_ * local_1258._12_4_ + local_1428._4_4_ * local_1248._12_4_
        ;
        auVar56._0_4_ = fVar72 + fVar72;
        auVar56._4_4_ = fVar142 + fVar142;
        auVar56._8_4_ = fVar146 + fVar146;
        auVar56._12_4_ = fVar126 + fVar126;
        auVar75._0_4_ = fVar147 * local_1248._0_4_;
        auVar75._4_4_ = fVar152 * local_1248._4_4_;
        auVar75._8_4_ = fVar154 * local_1248._8_4_;
        auVar75._12_4_ = fVar156 * local_1248._12_4_;
        fVar130 = fVar130 * local_1268._0_4_ + local_f88 * local_1258._0_4_ + auVar75._0_4_;
        fVar131 = fVar131 * local_1268._4_4_ + fStack_f84 * local_1258._4_4_ + auVar75._4_4_;
        fVar147 = fStack_1450 * local_1268._8_4_ + fStack_f80 * local_1258._8_4_ + auVar75._8_4_;
        fVar148 = fStack_144c * local_1268._12_4_ + fStack_f7c * local_1258._12_4_ + auVar75._12_4_;
        auVar51 = rcpps(auVar75,auVar56);
        fVar72 = auVar51._0_4_;
        fVar142 = auVar51._4_4_;
        fVar146 = auVar51._8_4_;
        fVar126 = auVar51._12_4_;
        fVar130 = ((1.0 - auVar56._0_4_ * fVar72) * fVar72 + fVar72) * (fVar130 + fVar130);
        fVar131 = ((1.0 - auVar56._4_4_ * fVar142) * fVar142 + fVar142) * (fVar131 + fVar131);
        fVar146 = ((1.0 - auVar56._8_4_ * fVar146) * fVar146 + fVar146) * (fVar147 + fVar147);
        fVar126 = ((1.0 - auVar56._12_4_ * fVar126) * fVar126 + fVar126) * (fVar148 + fVar148);
        fVar142 = *(float *)(ray + k * 4 + 0x80);
        fVar72 = *(float *)(ray + k * 4 + 0x30);
        auVar76._0_4_ = -(uint)(fVar130 <= fVar142 && fVar72 <= fVar130) & auVar122._0_4_;
        auVar76._4_4_ = -(uint)(fVar131 <= fVar142 && fVar72 <= fVar131) & auVar122._4_4_;
        auVar76._8_4_ = -(uint)(fVar146 <= fVar142 && fVar72 <= fVar146) & auVar122._8_4_;
        auVar76._12_4_ = -(uint)(fVar126 <= fVar142 && fVar72 <= fVar126) & auVar122._12_4_;
        uVar29 = movmskps(uVar29,auVar76);
        if (uVar29 == 0) goto LAB_00716e55;
        uVar73 = auVar76._0_4_ & -(uint)(auVar56._0_4_ != 0.0);
        uVar88 = auVar76._4_4_ & -(uint)(auVar56._4_4_ != 0.0);
        valid.field_0._0_8_ = CONCAT44(uVar88,uVar73);
        valid.field_0.i[2] = auVar76._8_4_ & -(uint)(auVar56._8_4_ != 0.0);
        valid.field_0.i[3] = auVar76._12_4_ & -(uint)(auVar56._12_4_ != 0.0);
        uVar29 = movmskps(uVar29,(undefined1  [16])valid.field_0);
        auVar114._4_4_ = fVar98;
        auVar114._0_4_ = fVar98;
        auVar114._8_4_ = fVar98;
        auVar114._12_4_ = fVar98;
        if (uVar29 != 0) {
          tNear.field_0.v[2] = local_1048._8_4_;
          tNear.field_0._0_8_ = local_1048._0_8_;
          tNear.field_0.v[3] = local_1048._12_4_;
          auVar28._4_4_ = fVar128;
          auVar28._0_4_ = fVar127;
          auVar28._8_4_ = fVar129;
          auVar28._12_4_ = fVar97;
          local_1278[0] = fVar130;
          local_1278[1] = fVar131;
          local_1278[2] = fVar146;
          local_1278[3] = fVar126;
          local_1238._8_8_ = uStack_1100;
          local_1238._0_8_ = local_1108;
          auVar51 = rcpps(auVar114,auVar28);
          fVar98 = auVar51._0_4_;
          fVar109 = auVar51._4_4_;
          fVar139 = auVar51._8_4_;
          fVar140 = auVar51._12_4_;
          fVar141 = (float)DAT_01f46a60;
          fVar147 = DAT_01f46a60._4_4_;
          fVar148 = DAT_01f46a60._12_4_;
          fVar72 = DAT_01f46a60._8_4_;
          fVar98 = (float)(-(uint)(1e-18 <= ABS(fVar127)) &
                          (uint)((fVar141 - fVar127 * fVar98) * fVar98 + fVar98));
          fVar109 = (float)(-(uint)(1e-18 <= ABS(fVar128)) &
                           (uint)((fVar147 - fVar128 * fVar109) * fVar109 + fVar109));
          fVar127 = (float)(-(uint)(1e-18 <= ABS(fVar129)) &
                           (uint)((fVar72 - fVar129 * fVar139) * fVar139 + fVar139));
          fVar128 = (float)(-(uint)(1e-18 <= ABS(fVar97)) &
                           (uint)((fVar148 - fVar97 * fVar140) * fVar140 + fVar140));
          auVar125._0_4_ = fVar132 * fVar98;
          auVar125._4_4_ = fVar135 * fVar109;
          auVar125._8_4_ = local_1048._8_4_ * fVar127;
          auVar125._12_4_ = local_1048._12_4_ * fVar128;
          auVar121 = minps(auVar125,_DAT_01f46a60);
          auVar103._0_4_ = fVar98 * local_1038._0_4_;
          auVar103._4_4_ = fVar109 * local_1038._4_4_;
          auVar103._8_4_ = fVar127 * local_1038._8_4_;
          auVar103._12_4_ = fVar128 * local_1038._12_4_;
          auVar51 = minps(auVar103,_DAT_01f46a60);
          auVar93._0_4_ = fVar141 - auVar121._0_4_;
          auVar93._4_4_ = fVar147 - auVar121._4_4_;
          auVar93._8_4_ = fVar72 - auVar121._8_4_;
          auVar93._12_4_ = fVar148 - auVar121._12_4_;
          auVar113._0_4_ = fVar141 - auVar51._0_4_;
          auVar113._4_4_ = fVar147 - auVar51._4_4_;
          auVar113._8_4_ = fVar72 - auVar51._8_4_;
          auVar113._12_4_ = fVar148 - auVar51._12_4_;
          local_1298 = blendvps(auVar121,auVar93,local_1238);
          local_1288 = blendvps(auVar51,auVar113,local_1238);
          auVar57._8_4_ = valid.field_0.i[2];
          auVar57._0_8_ = valid.field_0._0_8_;
          auVar57._12_4_ = valid.field_0.i[3];
          auVar24._4_4_ = fVar131;
          auVar24._0_4_ = fVar130;
          auVar24._8_4_ = fVar146;
          auVar24._12_4_ = fVar126;
          auVar121 = blendvps(_DAT_01f45a30,auVar24,auVar57);
          auVar104._4_4_ = auVar121._0_4_;
          auVar104._0_4_ = auVar121._4_4_;
          auVar104._8_4_ = auVar121._12_4_;
          auVar104._12_4_ = auVar121._8_4_;
          auVar51 = minps(auVar104,auVar121);
          auVar58._0_8_ = auVar51._8_8_;
          auVar58._8_4_ = auVar51._0_4_;
          auVar58._12_4_ = auVar51._4_4_;
          auVar51 = minps(auVar58,auVar51);
          auVar59._0_8_ =
               CONCAT44(-(uint)(auVar51._4_4_ == auVar121._4_4_) & uVar88,
                        -(uint)(auVar51._0_4_ == auVar121._0_4_) & uVar73);
          auVar59._8_4_ = -(uint)(auVar51._8_4_ == auVar121._8_4_) & valid.field_0.i[2];
          auVar59._12_4_ = -(uint)(auVar51._12_4_ == auVar121._12_4_) & valid.field_0.i[3];
          iVar30 = movmskps(uVar29,auVar59);
          aVar77 = valid.field_0;
          if (iVar30 != 0) {
            aVar77.i[2] = auVar59._8_4_;
            aVar77._0_8_ = auVar59._0_8_;
            aVar77.i[3] = auVar59._12_4_;
          }
          uVar31 = movmskps(iVar30,(undefined1  [16])aVar77);
          uVar40 = CONCAT44((int)((ulong)lVar32 >> 0x20),uVar31);
          lVar32 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
LAB_00715e28:
          uVar29 = puVar36[lVar32];
          pRVar33 = (RTCRayN *)(ulong)uVar29;
          pGVar20 = (pSVar14->geometries).items[(long)pRVar33].ptr;
          if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[lVar32] = 0.0;
LAB_007161a2:
            uVar29 = movmskps((int)pRVar33,(undefined1  [16])valid.field_0);
            if (uVar29 == 0) goto LAB_0071631d;
            auVar25._4_4_ = fVar131;
            auVar25._0_4_ = fVar130;
            auVar25._8_4_ = fVar146;
            auVar25._12_4_ = fVar126;
            auVar121 = blendvps(_DAT_01f45a30,auVar25,(undefined1  [16])valid.field_0);
            auVar105._4_4_ = auVar121._0_4_;
            auVar105._0_4_ = auVar121._4_4_;
            auVar105._8_4_ = auVar121._12_4_;
            auVar105._12_4_ = auVar121._8_4_;
            auVar51 = minps(auVar105,auVar121);
            auVar79._0_8_ = auVar51._8_8_;
            auVar79._8_4_ = auVar51._0_4_;
            auVar79._12_4_ = auVar51._4_4_;
            auVar51 = minps(auVar79,auVar51);
            auVar80._0_8_ =
                 CONCAT44(-(uint)(auVar51._4_4_ == auVar121._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar51._0_4_ == auVar121._0_4_) & valid.field_0._0_4_);
            auVar80._8_4_ = -(uint)(auVar51._8_4_ == auVar121._8_4_) & valid.field_0._8_4_;
            auVar80._12_4_ = -(uint)(auVar51._12_4_ == auVar121._12_4_) & valid.field_0._12_4_;
            iVar30 = movmskps(uVar29,auVar80);
            aVar61 = valid.field_0;
            if (iVar30 != 0) {
              aVar61.i[2] = auVar80._8_4_;
              aVar61._0_8_ = auVar80._0_8_;
              aVar61.i[3] = auVar80._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar61);
            uVar40 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar31);
            lVar32 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            goto LAB_00715e28;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1178 = *(undefined4 *)(local_1298 + lVar32 * 4);
            local_1168 = local_1278[lVar32 + -4];
            local_11a8._4_4_ = *(undefined4 *)(local_1268 + lVar32 * 4);
            local_1198._4_4_ = *(undefined4 *)(local_1258 + lVar32 * 4);
            local_1148._4_4_ = uVar29;
            local_1148._0_4_ = uVar29;
            local_1148._8_4_ = uVar29;
            local_1148._12_4_ = uVar29;
            uVar31 = *(undefined4 *)(lVar21 + 0x50 + lVar32 * 4);
            local_1158._4_4_ = uVar31;
            local_1158._0_4_ = uVar31;
            local_1158._8_4_ = uVar31;
            local_1158._12_4_ = uVar31;
            uVar31 = *(undefined4 *)(local_1248 + lVar32 * 4);
            local_1188._4_4_ = uVar31;
            local_1188._0_4_ = uVar31;
            local_1188._8_4_ = uVar31;
            local_1188._12_4_ = uVar31;
            local_11a8._0_4_ = local_11a8._4_4_;
            local_11a8._8_4_ = local_11a8._4_4_;
            local_11a8._12_4_ = local_11a8._4_4_;
            local_1198._0_4_ = local_1198._4_4_;
            local_1198._8_4_ = local_1198._4_4_;
            local_1198._12_4_ = local_1198._4_4_;
            uStack_1174 = local_1178;
            uStack_1170 = local_1178;
            uStack_116c = local_1178;
            fStack_1164 = local_1168;
            fStack_1160 = local_1168;
            fStack_115c = local_1168;
            local_1138 = context->user->instID[0];
            uStack_1134 = local_1138;
            uStack_1130 = local_1138;
            uStack_112c = local_1138;
            local_1128 = context->user->instPrimID[0];
            uStack_1124 = local_1128;
            uStack_1120 = local_1128;
            uStack_111c = local_1128;
            *(float *)(ray + k * 4 + 0x80) = local_1278[lVar32];
            local_13d8 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.valid = (int *)local_13d8;
            args.geometryUserPtr = pGVar20->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_11a8;
            args.N = 4;
            pRVar33 = (RTCRayN *)pGVar20->intersectionFilterN;
            args.ray = (RTCRayN *)ray;
            if (pRVar33 != (RTCRayN *)0x0) {
              pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
            }
            if (local_13d8 == (undefined1  [16])0x0) {
              auVar78._8_4_ = 0xffffffff;
              auVar78._0_8_ = 0xffffffffffffffff;
              auVar78._12_4_ = 0xffffffff;
              auVar78 = auVar78 ^ _DAT_01f46b70;
            }
            else {
              pRVar33 = (RTCRayN *)context->args->filter;
              if ((pRVar33 != (RTCRayN *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0))))
              {
                pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
              }
              auVar60._0_4_ = -(uint)(local_13d8._0_4_ == 0);
              auVar60._4_4_ = -(uint)(local_13d8._4_4_ == 0);
              auVar60._8_4_ = -(uint)(local_13d8._8_4_ == 0);
              auVar60._12_4_ = -(uint)(local_13d8._12_4_ == 0);
              auVar78 = auVar60 ^ _DAT_01f46b70;
              if (local_13d8 != (undefined1  [16])0x0) {
                auVar51 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar51;
                auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar51;
                pRVar33 = args.ray;
              }
            }
            if ((_DAT_01f46b40 & auVar78) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar142;
            }
            else {
              fVar142 = *(float *)(ray + k * 4 + 0x80);
            }
            valid.field_0.v[lVar32] = 0.0;
            valid.field_0.i[0] = -(uint)(fVar130 <= fVar142) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar131 <= fVar142) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar146 <= fVar142) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar126 <= fVar142) & valid.field_0.i[3];
            goto LAB_007161a2;
          }
          uVar31 = *(undefined4 *)(local_1298 + lVar32 * 4);
          fVar72 = local_1278[lVar32 + -4];
          *(float *)(ray + k * 4 + 0x80) = local_1278[lVar32];
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1268 + lVar32 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1258 + lVar32 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1248 + lVar32 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar31;
          *(float *)(ray + k * 4 + 0x100) = fVar72;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar21 + 0x50 + lVar32 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar29;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar29 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar29;
LAB_0071631d:
          fVar72 = *(float *)(ray + k * 4 + 0x10);
          fVar109 = *(float *)(ray + k * 4 + 0x20);
          fStack_130c = *(float *)(ray + k * 4 + 0x40);
          local_1478._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar114._4_4_ = fVar72;
          auVar114._0_4_ = fVar72;
          auVar114._8_4_ = fVar72;
          auVar114._12_4_ = fVar72;
          local_1478._0_4_ = local_1478._4_4_;
          fStack_1470 = (float)local_1478._4_4_;
          fStack_146c = (float)local_1478._4_4_;
          local_1428._4_4_ = *(float *)(ray + k * 4 + 0x60);
          local_1428._0_4_ = local_1428._4_4_;
          fStack_1420 = local_1428._4_4_;
          fStack_141c = local_1428._4_4_;
          fStack_1434 = local_1018 - fVar72;
          fVar139 = fStack_1014 - fVar72;
          fVar140 = fStack_1010 - fVar72;
          fVar141 = fStack_100c - fVar72;
          local_1358 = fStack_1430 - fVar109;
          fStack_1354 = fVar136 - fVar109;
          fStack_1350 = fStack_1430 - fVar109;
          fStack_134c = fStack_142c - fVar109;
          local_1348 = (local_1028 - fVar72) + fStack_1434;
          fStack_1344 = (fStack_1024 - fVar72) + fVar139;
          fStack_1340 = (fStack_1020 - fVar72) + fVar140;
          fStack_133c = (fStack_101c - fVar72) + fVar141;
          fStack_1334 = (local_1008._4_4_ - fVar109) + fStack_1354;
          local_1338 = ((float)local_1008 - fVar109) + local_1358;
          fStack_1330 = (fStack_1000 - fVar109) + fStack_1350;
          fStack_132c = (fStack_ffc - fVar109) + fStack_134c;
          fStack_1324 = local_1008._4_4_ - fVar109;
          local_1328 = (float)local_1008 - fVar109;
          fStack_1320 = fStack_1000 - fVar109;
          fStack_131c = fStack_ffc - fVar109;
          fStack_1384 = fStack_1024 - fVar72;
          local_1388 = local_1028 - fVar72;
          fStack_1380 = fStack_1020 - fVar72;
          fStack_137c = fStack_101c - fVar72;
        }
      }
      local_11c8 = local_11c8 - fVar109;
      fStack_11c4 = fStack_11c4 - fVar109;
      fStack_11c0 = fStack_11c0 - fVar109;
      fStack_11bc = fStack_11bc - fVar109;
      local_11e8 = local_11e8 - auVar114._0_4_;
      fStack_11e4 = fStack_11e4 - auVar114._4_4_;
      fStack_11e0 = fStack_11e0 - auVar114._8_4_;
      fStack_11dc = fStack_11dc - auVar114._12_4_;
      fVar72 = *(float *)(ray + k * 4);
      local_11d8._0_4_ = (float)local_11d8 - fVar72;
      local_11d8._4_4_ = local_11d8._4_4_ - fVar72;
      fStack_11d0 = fStack_11d0 - fVar72;
      fStack_11cc = fStack_11cc - fVar72;
      fVar157 = (float)local_1208 - fVar72;
      fVar159 = local_1208._4_4_ - fVar72;
      fVar161 = fStack_1200 - fVar72;
      fVar164 = fStack_11fc - fVar72;
      fVar136 = local_11f8 - fVar72;
      fVar146 = fStack_11f4 - fVar72;
      fVar127 = fStack_11f0 - fVar72;
      fVar72 = fStack_11ec - fVar72;
      fVar135 = fVar136 - (float)local_11d8;
      fVar148 = fVar146 - local_11d8._4_4_;
      fVar153 = fVar127 - fStack_11d0;
      fVar155 = fVar72 - fStack_11cc;
      fVar162 = fStack_1434 - local_11e8;
      fVar166 = fVar139 - fStack_11e4;
      fStack_1200 = fVar140 - fStack_11e0;
      fStack_11fc = fVar141 - fStack_11dc;
      local_11f8 = local_1358 - local_11c8;
      fStack_11f4 = fStack_1354 - fStack_11c4;
      fStack_11f0 = fStack_1350 - fStack_11c0;
      fStack_11ec = fStack_134c - fStack_11bc;
      local_1458._0_4_ = local_1388 - fStack_1434;
      local_1458._4_4_ = fStack_1384 - fVar139;
      fStack_1450 = fStack_1380 - fVar140;
      fStack_144c = fStack_137c - fVar141;
      fVar98 = local_1328 - local_1358;
      fVar109 = fStack_1324 - fStack_1354;
      fVar142 = fStack_1320 - fStack_1350;
      fVar126 = fStack_131c - fStack_134c;
      fVar147 = (float)local_11d8 - fVar157;
      fVar152 = local_11d8._4_4_ - fVar159;
      fVar154 = fStack_11d0 - fVar161;
      fVar156 = fStack_11cc - fVar164;
      local_1208 = CONCAT44(fVar166,fVar162);
      fVar163 = local_11e8 - local_1388;
      fVar158 = fStack_11e4 - fStack_1384;
      fVar169 = fStack_11e0 - fStack_1380;
      fVar170 = fStack_11dc - fStack_137c;
      fVar97 = local_11c8 - local_1328;
      fVar130 = fStack_11c4 - fStack_1324;
      fVar131 = fStack_11c0 - fStack_1320;
      fVar132 = fStack_11bc - fStack_131c;
      fVar149 = (fVar162 * (local_1358 + local_11c8) - (fStack_1434 + local_11e8) * local_11f8) *
                fStack_130c +
                ((fVar136 + (float)local_11d8) * local_11f8 - (local_1358 + local_11c8) * fVar135) *
                (float)local_1478._0_4_ +
                (fVar135 * (fStack_1434 + local_11e8) - (fVar136 + (float)local_11d8) * fVar162) *
                (float)local_1428;
      fVar165 = (fVar166 * (fStack_1354 + fStack_11c4) - (fVar139 + fStack_11e4) * fStack_11f4) *
                fStack_130c +
                ((fVar146 + local_11d8._4_4_) * fStack_11f4 - (fStack_1354 + fStack_11c4) * fVar148)
                * (float)local_1478._4_4_ +
                (fVar148 * (fVar139 + fStack_11e4) - (fVar146 + local_11d8._4_4_) * fVar166) *
                local_1428._4_4_;
      tNear.field_0._0_8_ = CONCAT44(fVar165,fVar149);
      tNear.field_0.v[2] =
           (fStack_1200 * (fStack_1350 + fStack_11c0) - (fVar140 + fStack_11e0) * fStack_11f0) *
           fStack_130c +
           ((fVar127 + fStack_11d0) * fStack_11f0 - (fStack_1350 + fStack_11c0) * fVar153) *
           fStack_1470 +
           (fVar153 * (fVar140 + fStack_11e0) - (fVar127 + fStack_11d0) * fStack_1200) * fStack_1420
      ;
      tNear.field_0.v[3] =
           (fStack_11fc * (fStack_134c + fStack_11bc) - (fVar141 + fStack_11dc) * fStack_11ec) *
           fStack_130c +
           ((fVar72 + fStack_11cc) * fStack_11ec - (fStack_134c + fStack_11bc) * fVar155) *
           fStack_146c +
           (fVar155 * (fVar141 + fStack_11dc) - (fVar72 + fStack_11cc) * fStack_11fc) * fStack_141c;
      fVar128 = fVar157 - fVar136;
      fVar139 = fVar159 - fVar146;
      fVar129 = fVar161 - fVar127;
      fVar140 = fVar164 - fVar72;
      auVar133._0_4_ =
           (fVar163 * (local_1328 + local_11c8) - (local_1388 + local_11e8) * fVar97) * fStack_130c
           + (((float)local_11d8 + fVar157) * fVar97 - (local_1328 + local_11c8) * fVar147) *
             (float)local_1478._0_4_ +
             (fVar147 * (local_1388 + local_11e8) - ((float)local_11d8 + fVar157) * fVar163) *
             (float)local_1428;
      auVar133._4_4_ =
           (fVar158 * (fStack_1324 + fStack_11c4) - (fStack_1384 + fStack_11e4) * fVar130) *
           fStack_130c +
           ((local_11d8._4_4_ + fVar159) * fVar130 - (fStack_1324 + fStack_11c4) * fVar152) *
           (float)local_1478._4_4_ +
           (fVar152 * (fStack_1384 + fStack_11e4) - (local_11d8._4_4_ + fVar159) * fVar158) *
           local_1428._4_4_;
      auVar133._8_4_ =
           (fVar169 * (fStack_1320 + fStack_11c0) - (fStack_1380 + fStack_11e0) * fVar131) *
           fStack_130c +
           ((fStack_11d0 + fVar161) * fVar131 - (fStack_1320 + fStack_11c0) * fVar154) * fStack_1470
           + (fVar154 * (fStack_1380 + fStack_11e0) - (fStack_11d0 + fVar161) * fVar169) *
             fStack_1420;
      auVar133._12_4_ =
           (fVar170 * (fStack_131c + fStack_11bc) - (fStack_137c + fStack_11dc) * fVar132) *
           fStack_130c +
           ((fStack_11cc + fVar164) * fVar132 - (fStack_131c + fStack_11bc) * fVar156) * fStack_146c
           + (fVar156 * (fStack_137c + fStack_11dc) - (fStack_11cc + fVar164) * fVar170) *
             fStack_141c;
      auVar62._0_4_ =
           ((float)local_1458._0_4_ * local_1338 - local_1348 * fVar98) * fStack_130c +
           ((fVar136 + fVar157) * fVar98 - local_1338 * fVar128) * (float)local_1478._0_4_ +
           (fVar128 * local_1348 - (fVar136 + fVar157) * (float)local_1458._0_4_) *
           (float)local_1428;
      auVar62._4_4_ =
           ((float)local_1458._4_4_ * fStack_1334 - fStack_1344 * fVar109) * fStack_130c +
           ((fVar146 + fVar159) * fVar109 - fStack_1334 * fVar139) * (float)local_1478._4_4_ +
           (fVar139 * fStack_1344 - (fVar146 + fVar159) * (float)local_1458._4_4_) *
           local_1428._4_4_;
      auVar62._8_4_ =
           (fStack_1450 * fStack_1330 - fStack_1340 * fVar142) * fStack_130c +
           ((fVar127 + fVar161) * fVar142 - fStack_1330 * fVar129) * fStack_1470 +
           (fVar129 * fStack_1340 - (fVar127 + fVar161) * fStack_1450) * fStack_1420;
      auVar62._12_4_ =
           (fStack_144c * fStack_132c - fStack_133c * fVar126) * fStack_130c +
           ((fVar72 + fVar164) * fVar126 - fStack_132c * fVar140) * fStack_146c +
           (fVar140 * fStack_133c - (fVar72 + fVar164) * fStack_144c) * fStack_141c;
      fVar141 = fVar149 + auVar133._0_4_ + auVar62._0_4_;
      fVar157 = fVar165 + auVar133._4_4_ + auVar62._4_4_;
      fVar159 = tNear.field_0.v[2] + auVar133._8_4_ + auVar62._8_4_;
      fVar161 = tNear.field_0.v[3] + auVar133._12_4_ + auVar62._12_4_;
      auVar81._8_4_ = tNear.field_0.i[2];
      auVar81._0_8_ = tNear.field_0._0_8_;
      auVar81._12_4_ = tNear.field_0.i[3];
      auVar51 = minps(auVar81,auVar133);
      auVar51 = minps(auVar51,auVar62);
      auVar94._8_4_ = tNear.field_0.i[2];
      auVar94._0_8_ = tNear.field_0._0_8_;
      auVar94._12_4_ = tNear.field_0.i[3];
      auVar121 = maxps(auVar94,auVar133);
      auVar121 = maxps(auVar121,auVar62);
      fVar72 = ABS(fVar141) * 1.1920929e-07;
      fVar136 = ABS(fVar157) * 1.1920929e-07;
      fVar146 = ABS(fVar159) * 1.1920929e-07;
      fVar127 = ABS(fVar161) * 1.1920929e-07;
      auVar95._4_4_ = -(uint)(auVar121._4_4_ <= fVar136);
      auVar95._0_4_ = -(uint)(auVar121._0_4_ <= fVar72);
      auVar95._8_4_ = -(uint)(auVar121._8_4_ <= fVar146);
      auVar95._12_4_ = -(uint)(auVar121._12_4_ <= fVar127);
      auVar82._4_4_ = -(uint)(-fVar136 <= auVar51._4_4_);
      auVar82._0_4_ = -(uint)(-fVar72 <= auVar51._0_4_);
      auVar82._8_4_ = -(uint)(-fVar146 <= auVar51._8_4_);
      auVar82._12_4_ = -(uint)(-fVar127 <= auVar51._12_4_);
      auVar95 = auVar95 | auVar82;
      iVar30 = movmskps(uVar29,auVar95);
      if (iVar30 != 0) {
        auVar151._0_4_ = fVar162 * fVar97 - fVar163 * local_11f8;
        auVar151._4_4_ = fVar166 * fVar130 - fVar158 * fStack_11f4;
        auVar151._8_4_ = fStack_1200 * fVar131 - fVar169 * fStack_11f0;
        auVar151._12_4_ = fStack_11fc * fVar132 - fVar170 * fStack_11ec;
        auVar115._0_4_ = fVar163 * fVar98 - (float)local_1458._0_4_ * fVar97;
        auVar115._4_4_ = fVar158 * fVar109 - (float)local_1458._4_4_ * fVar130;
        auVar115._8_4_ = fVar169 * fVar142 - fStack_1450 * fVar131;
        auVar115._12_4_ = fVar170 * fVar126 - fStack_144c * fVar132;
        auVar63._4_4_ = -(uint)(ABS(fVar158 * fStack_11f4) < ABS((float)local_1458._4_4_ * fVar130))
        ;
        auVar63._0_4_ = -(uint)(ABS(fVar163 * local_11f8) < ABS((float)local_1458._0_4_ * fVar97));
        auVar63._8_4_ = -(uint)(ABS(fVar169 * fStack_11f0) < ABS(fStack_1450 * fVar131));
        auVar63._12_4_ = -(uint)(ABS(fVar170 * fStack_11ec) < ABS(fStack_144c * fVar132));
        local_1268 = blendvps(auVar115,auVar151,auVar63);
        auVar123._0_4_ = local_11f8 * fVar147 - fVar135 * fVar97;
        auVar123._4_4_ = fStack_11f4 * fVar152 - fVar148 * fVar130;
        auVar123._8_4_ = fStack_11f0 * fVar154 - fVar153 * fVar131;
        auVar123._12_4_ = fStack_11ec * fVar156 - fVar155 * fVar132;
        auVar106._0_4_ = fVar128 * fVar97 - fVar147 * fVar98;
        auVar106._4_4_ = fVar139 * fVar130 - fVar152 * fVar109;
        auVar106._8_4_ = fVar129 * fVar131 - fVar154 * fVar142;
        auVar106._12_4_ = fVar140 * fVar132 - fVar156 * fVar126;
        auVar64._4_4_ = -(uint)(ABS(fVar148 * fVar130) < ABS(fVar152 * fVar109));
        auVar64._0_4_ = -(uint)(ABS(fVar135 * fVar97) < ABS(fVar147 * fVar98));
        auVar64._8_4_ = -(uint)(ABS(fVar153 * fVar131) < ABS(fVar154 * fVar142));
        auVar64._12_4_ = -(uint)(ABS(fVar155 * fVar132) < ABS(fVar156 * fVar126));
        local_1258 = blendvps(auVar106,auVar123,auVar64);
        auVar144._0_4_ = fVar135 * fVar163 - fVar147 * fVar162;
        auVar144._4_4_ = fVar148 * fVar158 - fVar152 * fVar166;
        auVar144._8_4_ = fVar153 * fVar169 - fVar154 * fStack_1200;
        auVar144._12_4_ = fVar155 * fVar170 - fVar156 * fStack_11fc;
        auVar134._0_4_ = fVar147 * (float)local_1458._0_4_ - fVar128 * fVar163;
        auVar134._4_4_ = fVar152 * (float)local_1458._4_4_ - fVar139 * fVar158;
        auVar134._8_4_ = fVar154 * fStack_1450 - fVar129 * fVar169;
        auVar134._12_4_ = fVar156 * fStack_144c - fVar140 * fVar170;
        auVar65._4_4_ = -(uint)(ABS(fVar152 * fVar166) < ABS(fVar139 * fVar158));
        auVar65._0_4_ = -(uint)(ABS(fVar147 * fVar162) < ABS(fVar128 * fVar163));
        auVar65._8_4_ = -(uint)(ABS(fVar154 * fStack_1200) < ABS(fVar129 * fVar169));
        auVar65._12_4_ = -(uint)(ABS(fVar156 * fStack_11fc) < ABS(fVar140 * fVar170));
        local_1248 = blendvps(auVar134,auVar144,auVar65);
        fVar72 = fStack_130c * local_1268._0_4_ +
                 (float)local_1478._0_4_ * local_1258._0_4_ + (float)local_1428 * local_1248._0_4_;
        fVar98 = fStack_130c * local_1268._4_4_ +
                 (float)local_1478._4_4_ * local_1258._4_4_ + local_1428._4_4_ * local_1248._4_4_;
        fVar109 = fStack_130c * local_1268._8_4_ +
                  fStack_1470 * local_1258._8_4_ + fStack_1420 * local_1248._8_4_;
        fVar136 = fStack_130c * local_1268._12_4_ +
                  fStack_146c * local_1258._12_4_ + fStack_141c * local_1248._12_4_;
        auVar168._0_4_ = fVar72 + fVar72;
        auVar168._4_4_ = fVar98 + fVar98;
        auVar168._8_4_ = fVar109 + fVar109;
        auVar168._12_4_ = fVar136 + fVar136;
        auVar66._0_4_ = local_11c8 * local_1248._0_4_;
        auVar66._4_4_ = fStack_11c4 * local_1248._4_4_;
        auVar66._8_4_ = fStack_11c0 * local_1248._8_4_;
        auVar66._12_4_ = fStack_11bc * local_1248._12_4_;
        fVar142 = (float)local_11d8 * local_1268._0_4_ +
                  local_11e8 * local_1258._0_4_ + auVar66._0_4_;
        fVar146 = local_11d8._4_4_ * local_1268._4_4_ +
                  fStack_11e4 * local_1258._4_4_ + auVar66._4_4_;
        fVar126 = fStack_11d0 * local_1268._8_4_ + fStack_11e0 * local_1258._8_4_ + auVar66._8_4_;
        fVar127 = fStack_11cc * local_1268._12_4_ + fStack_11dc * local_1258._12_4_ + auVar66._12_4_
        ;
        auVar51 = rcpps(auVar66,auVar168);
        fVar72 = auVar51._0_4_;
        fVar98 = auVar51._4_4_;
        fVar109 = auVar51._8_4_;
        fVar136 = auVar51._12_4_;
        fVar142 = ((1.0 - auVar168._0_4_ * fVar72) * fVar72 + fVar72) * (fVar142 + fVar142);
        fVar146 = ((1.0 - auVar168._4_4_ * fVar98) * fVar98 + fVar98) * (fVar146 + fVar146);
        fVar109 = ((1.0 - auVar168._8_4_ * fVar109) * fVar109 + fVar109) * (fVar126 + fVar126);
        fVar136 = ((1.0 - auVar168._12_4_ * fVar136) * fVar136 + fVar136) * (fVar127 + fVar127);
        fVar98 = *(float *)(ray + k * 4 + 0x80);
        fVar72 = *(float *)(ray + k * 4 + 0x30);
        local_1388 = auVar95._0_4_;
        fStack_1384 = auVar95._4_4_;
        fStack_1380 = auVar95._8_4_;
        fStack_137c = auVar95._12_4_;
        auVar83._0_4_ = -(uint)(fVar142 <= fVar98 && fVar72 <= fVar142) & (uint)local_1388;
        auVar83._4_4_ = -(uint)(fVar146 <= fVar98 && fVar72 <= fVar146) & (uint)fStack_1384;
        auVar83._8_4_ = -(uint)(fVar109 <= fVar98 && fVar72 <= fVar109) & (uint)fStack_1380;
        auVar83._12_4_ = -(uint)(fVar136 <= fVar98 && fVar72 <= fVar136) & (uint)fStack_137c;
        iVar30 = movmskps(iVar30,auVar83);
        if (iVar30 != 0) {
          uVar29 = auVar83._0_4_ & -(uint)(auVar168._0_4_ != 0.0);
          uVar73 = auVar83._4_4_ & -(uint)(auVar168._4_4_ != 0.0);
          valid.field_0._0_8_ = CONCAT44(uVar73,uVar29);
          valid.field_0.i[2] = auVar83._8_4_ & -(uint)(auVar168._8_4_ != 0.0);
          valid.field_0.i[3] = auVar83._12_4_ & -(uint)(auVar168._12_4_ != 0.0);
          iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
          if (iVar30 != 0) {
            auVar27._4_4_ = fVar157;
            auVar27._0_4_ = fVar141;
            auVar27._8_4_ = fVar159;
            auVar27._12_4_ = fVar161;
            local_1278[0] = fVar142;
            local_1278[1] = fVar146;
            local_1278[2] = fVar109;
            local_1278[3] = fVar136;
            local_1238._8_8_ = uStack_1110;
            local_1238._0_8_ = local_1118;
            pSVar14 = context->scene;
            auVar51 = rcpps(auVar123,auVar27);
            fVar126 = auVar51._0_4_;
            fVar127 = auVar51._4_4_;
            fVar128 = auVar51._8_4_;
            fVar139 = auVar51._12_4_;
            fVar129 = (float)DAT_01f46a60;
            fVar140 = DAT_01f46a60._4_4_;
            fVar97 = DAT_01f46a60._12_4_;
            fVar72 = DAT_01f46a60._8_4_;
            fVar126 = (float)(-(uint)(1e-18 <= ABS(fVar141)) &
                             (uint)((fVar129 - fVar141 * fVar126) * fVar126 + fVar126));
            fVar127 = (float)(-(uint)(1e-18 <= ABS(fVar157)) &
                             (uint)((fVar140 - fVar157 * fVar127) * fVar127 + fVar127));
            fVar128 = (float)(-(uint)(1e-18 <= ABS(fVar159)) &
                             (uint)((fVar72 - fVar159 * fVar128) * fVar128 + fVar128));
            fVar139 = (float)(-(uint)(1e-18 <= ABS(fVar161)) &
                             (uint)((fVar97 - fVar161 * fVar139) * fVar139 + fVar139));
            auVar145._0_4_ = fVar149 * fVar126;
            auVar145._4_4_ = fVar165 * fVar127;
            auVar145._8_4_ = tNear.field_0.v[2] * fVar128;
            auVar145._12_4_ = tNear.field_0.v[3] * fVar139;
            auVar121 = minps(auVar145,_DAT_01f46a60);
            auVar138._0_4_ = fVar126 * auVar133._0_4_;
            auVar138._4_4_ = fVar127 * auVar133._4_4_;
            auVar138._8_4_ = fVar128 * auVar133._8_4_;
            auVar138._12_4_ = fVar139 * auVar133._12_4_;
            auVar51 = minps(auVar138,_DAT_01f46a60);
            auVar96._0_4_ = fVar129 - auVar121._0_4_;
            auVar96._4_4_ = fVar140 - auVar121._4_4_;
            auVar96._8_4_ = fVar72 - auVar121._8_4_;
            auVar96._12_4_ = fVar97 - auVar121._12_4_;
            auVar124._0_4_ = fVar129 - auVar51._0_4_;
            auVar124._4_4_ = fVar140 - auVar51._4_4_;
            auVar124._8_4_ = fVar72 - auVar51._8_4_;
            auVar124._12_4_ = fVar97 - auVar51._12_4_;
            local_1298 = blendvps(auVar121,auVar96,local_1238);
            local_1288 = blendvps(auVar51,auVar124,local_1238);
            auVar67._8_4_ = valid.field_0.i[2];
            auVar67._0_8_ = valid.field_0._0_8_;
            auVar67._12_4_ = valid.field_0.i[3];
            auVar22._4_4_ = fVar146;
            auVar22._0_4_ = fVar142;
            auVar22._8_4_ = fVar109;
            auVar22._12_4_ = fVar136;
            auVar121 = blendvps(_DAT_01f45a30,auVar22,auVar67);
            auVar107._4_4_ = auVar121._0_4_;
            auVar107._0_4_ = auVar121._4_4_;
            auVar107._8_4_ = auVar121._12_4_;
            auVar107._12_4_ = auVar121._8_4_;
            auVar51 = minps(auVar107,auVar121);
            auVar68._0_8_ = auVar51._8_8_;
            auVar68._8_4_ = auVar51._0_4_;
            auVar68._12_4_ = auVar51._4_4_;
            auVar51 = minps(auVar68,auVar51);
            auVar69._0_8_ =
                 CONCAT44(-(uint)(auVar51._4_4_ == auVar121._4_4_) & uVar73,
                          -(uint)(auVar51._0_4_ == auVar121._0_4_) & uVar29);
            auVar69._8_4_ = -(uint)(auVar51._8_4_ == auVar121._8_4_) & valid.field_0.i[2];
            auVar69._12_4_ = -(uint)(auVar51._12_4_ == auVar121._12_4_) & valid.field_0.i[3];
            iVar30 = movmskps((int)context,auVar69);
            aVar84 = valid.field_0;
            if (iVar30 != 0) {
              aVar84.i[2] = auVar69._8_4_;
              aVar84._0_8_ = auVar69._0_8_;
              aVar84.i[3] = auVar69._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar84);
            uVar40 = CONCAT44((int)((ulong)context >> 0x20),uVar31);
            lVar32 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
LAB_00716905:
            uVar29 = puVar36[lVar32];
            pRVar33 = (RTCRayN *)(ulong)uVar29;
            pGVar20 = (pSVar14->geometries).items[(long)pRVar33].ptr;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar32] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar31 = *(undefined4 *)(local_1298 + lVar32 * 4);
                fVar72 = local_1278[lVar32 + -4];
                *(float *)(ray + k * 4 + 0x80) = local_1278[lVar32];
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1268 + lVar32 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1258 + lVar32 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1248 + lVar32 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar31;
                *(float *)(ray + k * 4 + 0x100) = fVar72;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar21 + 0x50 + lVar32 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar29;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00716ded;
              }
              local_1178 = *(undefined4 *)(local_1298 + lVar32 * 4);
              local_1168 = local_1278[lVar32 + -4];
              uVar31 = *(undefined4 *)(local_1268 + lVar32 * 4);
              uVar11 = *(undefined4 *)(local_1258 + lVar32 * 4);
              local_1148._4_4_ = uVar29;
              local_1148._0_4_ = uVar29;
              local_1148._8_4_ = uVar29;
              local_1148._12_4_ = uVar29;
              uVar12 = *(undefined4 *)(lVar21 + 0x50 + lVar32 * 4);
              local_1158._4_4_ = uVar12;
              local_1158._0_4_ = uVar12;
              local_1158._8_4_ = uVar12;
              local_1158._12_4_ = uVar12;
              local_11a8._4_4_ = uVar31;
              local_11a8._0_4_ = uVar31;
              local_11a8._8_4_ = uVar31;
              local_11a8._12_4_ = uVar31;
              local_1198._4_4_ = uVar11;
              local_1198._0_4_ = uVar11;
              local_1198._8_4_ = uVar11;
              local_1198._12_4_ = uVar11;
              uVar31 = *(undefined4 *)(local_1248 + lVar32 * 4);
              local_1188._4_4_ = uVar31;
              local_1188._0_4_ = uVar31;
              local_1188._8_4_ = uVar31;
              local_1188._12_4_ = uVar31;
              uStack_1174 = local_1178;
              uStack_1170 = local_1178;
              uStack_116c = local_1178;
              fStack_1164 = local_1168;
              fStack_1160 = local_1168;
              fStack_115c = local_1168;
              local_1138 = context->user->instID[0];
              uStack_1134 = local_1138;
              uStack_1130 = local_1138;
              uStack_112c = local_1138;
              local_1128 = context->user->instPrimID[0];
              uStack_1124 = local_1128;
              uStack_1120 = local_1128;
              uStack_111c = local_1128;
              *(float *)(ray + k * 4 + 0x80) = local_1278[lVar32];
              local_13d8 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
              args.valid = (int *)local_13d8;
              args.geometryUserPtr = pGVar20->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_11a8;
              args.N = 4;
              pRVar33 = (RTCRayN *)pGVar20->intersectionFilterN;
              local_1458._4_4_ = fVar146;
              local_1458._0_4_ = fVar142;
              fStack_1450 = fVar109;
              fStack_144c = fVar136;
              args.ray = (RTCRayN *)ray;
              if (pRVar33 != (RTCRayN *)0x0) {
                pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
              }
              if (local_13d8 == (undefined1  [16])0x0) {
                auVar85._8_4_ = 0xffffffff;
                auVar85._0_8_ = 0xffffffffffffffff;
                auVar85._12_4_ = 0xffffffff;
                auVar85 = auVar85 ^ _DAT_01f46b70;
              }
              else {
                pRVar33 = (RTCRayN *)context->args->filter;
                if ((pRVar33 != (RTCRayN *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                }
                auVar70._0_4_ = -(uint)(local_13d8._0_4_ == 0);
                auVar70._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                auVar70._8_4_ = -(uint)(local_13d8._8_4_ == 0);
                auVar70._12_4_ = -(uint)(local_13d8._12_4_ == 0);
                auVar85 = auVar70 ^ _DAT_01f46b70;
                if (local_13d8 != (undefined1  [16])0x0) {
                  auVar51 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar51;
                  auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar70);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar51;
                  pRVar33 = args.ray;
                }
              }
              if ((_DAT_01f46b40 & auVar85) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar98;
              }
              else {
                fVar98 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar32] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar142 <= fVar98) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar146 <= fVar98) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar109 <= fVar98) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar136 <= fVar98) & valid.field_0.i[3];
            }
            iVar30 = movmskps((int)pRVar33,(undefined1  [16])valid.field_0);
            if (iVar30 == 0) goto LAB_00716ded;
            auVar23._4_4_ = fVar146;
            auVar23._0_4_ = fVar142;
            auVar23._8_4_ = fVar109;
            auVar23._12_4_ = fVar136;
            auVar121 = blendvps(_DAT_01f45a30,auVar23,(undefined1  [16])valid.field_0);
            auVar108._4_4_ = auVar121._0_4_;
            auVar108._0_4_ = auVar121._4_4_;
            auVar108._8_4_ = auVar121._12_4_;
            auVar108._12_4_ = auVar121._8_4_;
            auVar51 = minps(auVar108,auVar121);
            auVar86._0_8_ = auVar51._8_8_;
            auVar86._8_4_ = auVar51._0_4_;
            auVar86._12_4_ = auVar51._4_4_;
            auVar51 = minps(auVar86,auVar51);
            auVar87._0_8_ =
                 CONCAT44(-(uint)(auVar51._4_4_ == auVar121._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar51._0_4_ == auVar121._0_4_) & valid.field_0._0_4_);
            auVar87._8_4_ = -(uint)(auVar51._8_4_ == auVar121._8_4_) & valid.field_0._8_4_;
            auVar87._12_4_ = -(uint)(auVar51._12_4_ == auVar121._12_4_) & valid.field_0._12_4_;
            iVar30 = movmskps(iVar30,auVar87);
            aVar71 = valid.field_0;
            if (iVar30 != 0) {
              aVar71.i[2] = auVar87._8_4_;
              aVar71._0_8_ = auVar87._0_8_;
              aVar71.i[3] = auVar87._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar71);
            uVar40 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar31);
            lVar32 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            goto LAB_00716905;
          }
        }
      }
LAB_00716ded:
      auVar51 = local_10f8;
      fVar126 = local_10e8;
      fVar127 = fStack_10e4;
      fVar128 = fStack_10e0;
      fVar139 = fStack_10dc;
      fVar72 = local_1068;
      fVar129 = fStack_1064;
      fVar140 = fStack_1060;
      fVar97 = fStack_105c;
      fVar109 = local_1088;
      fVar141 = fStack_1084;
      fVar130 = fStack_1080;
      fVar131 = fStack_107c;
      fVar98 = local_1078;
      fVar132 = fStack_1074;
      fVar135 = fStack_1070;
      fVar147 = fStack_106c;
      fVar136 = local_1098;
      fVar148 = fStack_1094;
      fVar152 = fStack_1090;
      fVar153 = fStack_108c;
      fVar142 = local_10a8;
      fVar154 = fStack_10a4;
      fVar155 = fStack_10a0;
      fVar156 = fStack_109c;
      fVar146 = local_10b8;
      fVar157 = fStack_10b4;
      fVar159 = fStack_10b0;
      fVar161 = fStack_10ac;
      fVar158 = local_10c8;
      fVar162 = fStack_10c4;
      fVar163 = fStack_10c0;
      fVar166 = fStack_10bc;
      fVar165 = local_10d8;
      fVar169 = fStack_10d4;
      fVar170 = fStack_10d0;
      fVar149 = fStack_10cc;
    }
    uVar31 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar121._4_4_ = uVar31;
    auVar121._0_4_ = uVar31;
    auVar121._8_4_ = uVar31;
    auVar121._12_4_ = uVar31;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }